

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.h
# Opt level: O2

bool __thiscall
Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::IsFreeOrDecommitted
          (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *this,void *address,
          uint pageCount)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  undefined4 *puVar4;
  char *pcVar5;
  uint index;
  
  pcVar5 = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).address;
  if ((address < pcVar5) ||
     (pcVar5 + ((this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).segmentPageCount -
               (ulong)(this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).
                      secondaryAllocPageCount) * 0x1000 <= address)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.h"
                       ,0x14b,"(this->IsInSegment(address))","this->IsInSegment(address)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    pcVar5 = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).address;
  }
  index = (uint)((int)address - (int)pcVar5) >> 0xc;
  BVar3 = BVStatic<272UL>::TestRange(&this->decommitPages,index,pageCount);
  bVar2 = true;
  if (BVar3 == '\0') {
    BVar3 = BVStatic<272UL>::TestRange(&this->freePages,index,pageCount);
    bVar2 = BVar3 != '\0';
  }
  return bVar2;
}

Assistant:

bool IsFreeOrDecommitted(void* address, uint pageCount) const
    {
        Assert(this->IsInSegment(address));

        uint base = GetBitRangeBase(address);
        return this->TestRangeInDecommitPagesBitVector(base, pageCount) || this->TestRangeInFreePagesBitVector(base, pageCount);
    }